

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O2

Continue __thiscall
cmCoreTryCompile::Arguments::SetSourceType(Arguments *this,string_view sourceType)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  string_view sourceType_local;
  string local_38;
  
  sourceType_local._M_str = sourceType._M_str;
  sourceType_local._M_len = sourceType._M_len;
  __y._M_str = "NORMAL";
  __y._M_len = 6;
  bVar1 = std::operator==(sourceType,__y);
  if (bVar1) {
    this->SourceTypeContext = Normal;
  }
  else {
    __y_00._M_str = "CXX_MODULE";
    __y_00._M_len = 10;
    bVar1 = std::operator==(sourceType,__y_00);
    if (bVar1) {
      this->SourceTypeContext = CxxModule;
    }
    else if ((this->SourceTypeError)._M_string_length == 0) {
      cmStrCat<char_const(&)[24],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[43]>
                (&local_38,(char (*) [24])"Invalid \'SOURCE_TYPE\' \'",&sourceType_local,
                 (char (*) [43])"\'; must be one of \'SOURCE\' or \'CXX_MODULE\'");
      std::__cxx11::string::operator=((string *)&this->SourceTypeError,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return Yes;
}

Assistant:

ArgumentParser::Continue cmCoreTryCompile::Arguments::SetSourceType(
  cm::string_view sourceType)
{
  bool matched = false;
  if (sourceType == "NORMAL"_s) {
    this->SourceTypeContext = SourceType::Normal;
    matched = true;
  } else if (sourceType == "CXX_MODULE"_s) {
    this->SourceTypeContext = SourceType::CxxModule;
    matched = true;
  }

  if (!matched && this->SourceTypeError.empty()) {
    // Only remember one error at a time; all other errors related to argument
    // parsing are "indicate one error and return" anyways.
    this->SourceTypeError =
      cmStrCat("Invalid 'SOURCE_TYPE' '", sourceType,
               "'; must be one of 'SOURCE' or 'CXX_MODULE'");
  }
  return ArgumentParser::Continue::Yes;
}